

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O3

double modelhess(double *A,int N,double *dx,double eps,double *L)

{
  ulong uVar1;
  double *array;
  int iVar2;
  ulong uVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double *pdVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double local_48;
  
  if (eps < 0.0) {
    dVar11 = sqrt(eps);
  }
  else {
    dVar11 = SQRT(eps);
  }
  lVar6 = (long)N;
  array = (double *)malloc(lVar6 * lVar6 * 8);
  uVar1 = (ulong)(uint)N;
  if (0 < N) {
    uVar3 = 0;
    pdVar4 = A;
    do {
      uVar7 = 0;
      do {
        pdVar4[uVar7] = pdVar4[uVar7] / (dx[uVar3] * dx[uVar7]);
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
      uVar3 = uVar3 + 1;
      pdVar4 = pdVar4 + uVar1;
    } while (uVar3 != uVar1);
    if (0 < N) {
      iVar2 = 0;
      uVar3 = 0;
      do {
        array[uVar3] = A[iVar2];
        uVar3 = uVar3 + 1;
        iVar2 = iVar2 + N + 1;
      } while (uVar1 != uVar3);
    }
  }
  dVar12 = array_max(array,N);
  dVar13 = array_min(array,N);
  dVar14 = dVar12;
  if (dVar12 <= 0.0) {
    dVar14 = 0.0;
  }
  if (0 < N) {
    memset(array,0,uVar1 * 8);
  }
  dVar15 = 0.0;
  if (dVar13 <= dVar11 * dVar14) {
    dVar15 = ((dVar14 - dVar13) + (dVar14 - dVar13)) * dVar11 - dVar13;
    dVar12 = dVar12 + dVar15;
  }
  if (N < 1) {
    iVar2 = 0;
  }
  else {
    uVar3 = 0;
    iVar2 = 0;
    pdVar4 = A;
    do {
      uVar7 = 0;
      do {
        if (uVar3 < uVar7) {
          array[iVar2] = pdVar4[uVar7];
          iVar2 = iVar2 + 1;
        }
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
      uVar3 = uVar3 + 1;
      pdVar4 = pdVar4 + uVar1;
    } while (uVar3 != uVar1);
  }
  dVar14 = array_max_abs(array,iVar2);
  dVar13 = (dVar11 + dVar11 + 1.0) * dVar14;
  if (dVar12 < dVar13) {
    dVar15 = dVar15 + (dVar11 + dVar11) * dVar14 + (dVar14 - dVar12);
    dVar12 = dVar13;
  }
  if ((dVar12 == 0.0) && (!NAN(dVar12))) {
    dVar15 = 1.0;
  }
  if ((dVar12 == 0.0) && (!NAN(dVar12))) {
    dVar12 = 1.0;
  }
  if (0.0 < dVar15 && 0 < N) {
    iVar2 = 0;
    uVar3 = uVar1;
    do {
      A[iVar2] = A[iVar2] + dVar15;
      iVar2 = iVar2 + N + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  if (dVar12 <= dVar14 / (double)N) {
    dVar12 = dVar14 / (double)N;
  }
  if (dVar12 < 0.0) {
    dVar12 = sqrt(dVar12);
  }
  else {
    dVar12 = SQRT(dVar12);
  }
  dVar12 = cholmod(A,N,L,eps,dVar12);
  if (0.0 < dVar12) {
    dVar14 = *A;
    dVar13 = dVar14;
    if (0 < N) {
      uVar3 = uVar1;
      pdVar4 = A;
      uVar7 = 0;
      pdVar10 = A;
      do {
        dVar15 = 0.0;
        if (uVar7 != 0) {
          uVar8 = 0;
          do {
            dVar15 = dVar15 + ABS(pdVar4[uVar8]);
            uVar8 = uVar8 + 1;
          } while (uVar7 != uVar8);
        }
        uVar8 = uVar7 + 1;
        if ((long)uVar8 < lVar6) {
          uVar9 = 1;
          do {
            dVar15 = dVar15 + ABS(pdVar10[uVar9]);
            uVar9 = uVar9 + 1;
          } while (uVar3 != uVar9);
        }
        dVar16 = dVar15 + A[uVar7 * uVar1 + uVar7];
        if (dVar16 <= dVar13) {
          dVar16 = dVar13;
        }
        dVar13 = dVar16;
        dVar15 = A[uVar7 * uVar1 + uVar7] - dVar15;
        if (dVar14 <= dVar15) {
          dVar15 = dVar14;
        }
        dVar14 = dVar15;
        pdVar4 = pdVar4 + uVar1;
        pdVar10 = pdVar10 + uVar1 + 1;
        uVar3 = uVar3 - 1;
        uVar7 = uVar8;
      } while (uVar8 != uVar1);
    }
    if (N < 1) {
      local_48 = cholmod(A,N,L,eps,0.0);
      goto LAB_00123b6f;
    }
    dVar14 = (dVar13 - dVar14) * dVar11 - dVar14;
    dVar11 = 0.0;
    if (0.0 <= dVar14) {
      dVar11 = dVar14;
    }
    if (dVar12 <= dVar11) {
      dVar11 = dVar12;
    }
    iVar2 = 0;
    uVar3 = uVar1;
    do {
      A[iVar2] = A[iVar2] + dVar11;
      iVar2 = iVar2 + N + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  local_48 = cholmod(A,N,L,eps,0.0);
  if (0 < N) {
    uVar3 = 0;
    do {
      uVar7 = 0;
      do {
        A[uVar7] = dx[uVar3] * dx[uVar7] * A[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
      uVar3 = uVar3 + 1;
      A = A + uVar1;
    } while (uVar3 != uVar1);
    if (0 < N) {
      lVar6 = 1;
      uVar3 = 0;
      do {
        lVar5 = 0;
        do {
          L[lVar5] = dx[uVar3] * L[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar6 != lVar5);
        uVar3 = uVar3 + 1;
        lVar6 = lVar6 + 1;
        L = L + uVar1;
      } while (uVar3 != uVar1);
    }
  }
LAB_00123b6f:
  free(array);
  return local_48;
}

Assistant:

double modelhess(double *A,int N,double *dx,double eps,double *L) {
	/*
	 * Algorithm 5.5.1 Dennis, Schnabel, Numerical Methods for Unconstrained Optimization and 
	 * Non-Linear Equations
	 */ 
	 double *U22;
	 double sqrteps,maxdiag,mindiag,maxposdiag,u;
	 double maxoffdiag,maxinp,maxadd;
	 double maxev,minev,offrow,sdd;
	 int step,i,j,k;
	 
	 sqrteps = sqrt(eps);
	 
	 U22 = (double*) malloc(sizeof(double) * N * N);
	 
	//scale
	
	for(i = 0;i < N;++i) {
		step = i*N;
		for(j = 0;j < N;++j) {
			A[step+j] /= (dx[i] * dx[j]);
		}
	}
	
	for(i = 0; i < N;++i) {
		U22[i] = A[i+i*N];
	}
	
	maxdiag = array_max(U22,N);
	mindiag = array_min(U22,N);
	
	maxposdiag = 0.0;
	
	if (maxdiag > maxposdiag) {
		maxposdiag = maxdiag;
	}
	
	for(i = 0; i < N;++i) {
		U22[i] = 0.0;
	}
	u = 0.0;
	if (mindiag <= sqrteps*maxposdiag) {
		u = 2 * (maxposdiag - mindiag) * sqrteps - mindiag;
		maxdiag += u;
	}
	k = 0;
	for (i = 0; i < N;++i) {
		for(j = 0;j < N;++j) {
			if (j > i) {
				U22[k] = A[i*N+j];
				k++;
			}
		}
	}
	
	maxoffdiag = array_max_abs(U22,k);
	
	if ( maxoffdiag*(1+2*sqrteps) > maxdiag) {
		u += (maxoffdiag - maxdiag) + 2*sqrteps*maxoffdiag;
		maxdiag = maxoffdiag*(1+2*sqrteps);
	}
	
	if (maxdiag == 0) {
		u = 1;
		maxdiag = 1;
	}
	
	if (u > 0) {
		for(i=0;i < N;++i) {
			A[i*N+i] += u;
		}
	}
	
	if (maxdiag > maxoffdiag / N) {
		maxinp = sqrt(maxdiag);
	} else {
		maxinp = sqrt(maxoffdiag / N);
	}
	
	maxadd = cholmod(A,N,L,eps,maxinp);
	
	if (maxadd > 0) {
		maxev = minev = A[0];
		for(i = 0; i < N;++i) {
			offrow = 0.0;
			step = i*N;
			
			for(j = 0; j < i;++j) {
				offrow += fabs(A[step+j]);
			}
			
			for(j = i+1; j < N;++j) {
				offrow += fabs(A[step+j]);
			}
			
			if (maxev < A[step+i] + offrow) {
				maxev = A[step+i] + offrow;
			}
			if (minev > A[step+i] - offrow) {
				minev = A[step+i] - offrow;
			}
			
		}
		sdd = (maxev - minev) * sqrteps - minev;
		if (sdd < 0) {
			sdd = 0;
		}
		if (maxadd > sdd) {
			u = sdd;
		} else {
			u = maxadd;
		}
		
		for(i = 0; i < N;++i) {
			A[i*N+i] += u; 
		}
	}
	
	maxadd = cholmod(A,N,L,eps,0.0);
	
	//unscale
	
	for(i = 0;i < N;++i) {
		step = i*N;
		for(j = 0;j < N;++j) {
			A[step+j] *= (dx[i] * dx[j]);
		}
	}
	
	for(i = 0;i < N;++i) {
		step = i*N;
		for(j = 0;j < i+1;++j) {
			L[step+j] *= dx[i];
		}
	}
	
	free(U22);
	
	return maxadd;
	 
}